

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pthread.cc
# Opt level: O1

void __thiscall gutil::Thread::join(Thread *this)

{
  if (this->p->running == true) {
    pthread_join(this->p->thread,(void **)0x0);
    this->p->running = false;
  }
  return;
}

Assistant:

void Thread::join()
{
  if (p->running)
  {
#ifndef NDEBUG
    int err=
#endif
      pthread_join(p->thread, 0);

    p->running=false;

    assert(err == 0);
  }
}